

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bfgs.cc
# Opt level: O2

double add_regularization<dense_parameters>
                 (vw *all,bfgs *b,float regularization,dense_parameters *weights)

{
  float *pfVar1;
  ulong uVar2;
  float *pfVar3;
  byte bVar4;
  long lVar5;
  float *pfVar6;
  uint64_t uVar7;
  weight *pwVar8;
  ulong uVar9;
  double dVar10;
  double dVar11;
  float fVar12;
  double dVar13;
  
  uVar9 = 1L << ((byte)weights->_stride_shift & 0x3f);
  pwVar8 = b->regularizers;
  pfVar3 = weights->_begin;
  dVar11 = (double)regularization;
  if (pwVar8 == (weight *)0x0) {
    dVar10 = 0.0;
    for (pfVar6 = pfVar3; uVar7 = weights->_weight_mask, pfVar1 = pfVar3,
        pfVar6 != pfVar3 + uVar7 + 1; pfVar6 = pfVar6 + uVar9) {
      pfVar6[1] = regularization * *pfVar6 + pfVar6[1];
      dVar13 = (double)*pfVar6;
      dVar10 = dVar10 + dVar11 * 0.5 * dVar13 * dVar13;
      pfVar3 = weights->_begin;
    }
  }
  else {
    dVar10 = 0.0;
    pfVar1 = pfVar3;
    for (lVar5 = 0; uVar7 = weights->_weight_mask,
        (float *)((long)pfVar3 + lVar5) != pfVar1 + uVar7 + 1;
        lVar5 = lVar5 + (uVar9 & 0xffffffff) * 4) {
      uVar2 = (ulong)(lVar5 >> 2) >> ((byte)weights->_stride_shift & 0x3f);
      fVar12 = *(float *)((long)pfVar3 + lVar5) - pwVar8[uVar2 * 2 + 1];
      *(float *)((long)pfVar3 + lVar5 + 4) =
           pwVar8[uVar2 * 2] * fVar12 + *(float *)((long)pfVar3 + lVar5 + 4);
      pwVar8 = b->regularizers;
      dVar13 = (double)fVar12;
      dVar10 = dVar10 + (double)pwVar8[uVar2 * 2] * 0.5 * dVar13 * dVar13;
      pfVar1 = weights->_begin;
    }
  }
  if (all->no_bias == true) {
    pwVar8 = b->regularizers;
    bVar4 = (byte)weights->_stride_shift;
    if (pwVar8 == (weight *)0x0) {
      uVar9 = uVar7 & 0xb1c55cL << (bVar4 & 0x3f);
      pfVar1[uVar9 + 1] = pfVar1[uVar9 + 1] - regularization * pfVar1[uVar9];
      fVar12 = weights->_begin
               [0xb1c55cL << ((byte)weights->_stride_shift & 0x3f) & weights->_weight_mask];
    }
    else {
      uVar2 = uVar7 & 0xb1c55cL << (bVar4 & 0x3f);
      uVar9 = (ulong)(uint)((int)(0xb1c55cL >> (bVar4 & 0x3f)) << 3);
      fVar12 = pfVar1[uVar2] - *(float *)((long)pwVar8 + uVar9 + 4);
      pfVar1[uVar2 + 1] = pfVar1[uVar2 + 1] - *(float *)((long)pwVar8 + uVar9) * fVar12;
      dVar11 = (double)*(float *)((long)b->regularizers + uVar9);
    }
    dVar10 = dVar11 * -0.5 * (double)fVar12 * (double)fVar12 + dVar10;
  }
  return dVar10;
}

Assistant:

double add_regularization(vw& all, bfgs& b, float regularization, T& weights)
{
  // compute the derivative difference
  double ret = 0.;

  if (b.regularizers == nullptr)
    for (typename T::iterator w = weights.begin(); w != weights.end(); ++w)
    {
      (&(*w))[W_GT] += regularization * (*w);
      ret += 0.5 * regularization * (*w) * (*w);
    }
  else
    for (typename T::iterator w = weights.begin(); w != weights.end(); ++w)
    {
      uint64_t i = w.index() >> weights.stride_shift();
      weight delta_weight = *w - b.regularizers[2 * i + 1];
      (&(*w))[W_GT] += b.regularizers[2 * i] * delta_weight;
      ret += 0.5 * b.regularizers[2 * i] * delta_weight * delta_weight;
    }

  // if we're not regularizing the intercept term, then subtract it off from the result above
  // when accessing weights[constant], always use weights.strided_index(constant)
  if (all.no_bias)
  {
    if (b.regularizers == nullptr)
    {
      (&weights.strided_index(constant))[W_GT] -= regularization * (weights.strided_index(constant));
      ret -= 0.5 * regularization * (weights.strided_index(constant)) * (weights.strided_index(constant));
    }
    else
    {
      uint64_t i = constant >> weights.stride_shift();
      weight delta_weight = (weights.strided_index(constant)) - b.regularizers[2 * i + 1];
      (&weights.strided_index(constant))[W_GT] -= b.regularizers[2 * i] * delta_weight;
      ret -= 0.5 * b.regularizers[2 * i] * delta_weight * delta_weight;
    }
  }

  return ret;
}